

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Any::
Any<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function_const>,void>
          (Any *this,shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *t_value)

{
  Data_Impl<std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>_> *t_type;
  shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *in_RDI;
  pointer in_stack_ffffffffffffffa8;
  Data_Impl<std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>_> *this_00;
  
  t_type = (Data_Impl<std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>_> *)
           operator_new(0x20);
  this_00 = t_type;
  std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>::shared_ptr
            (in_RDI,(shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *)
                    in_stack_ffffffffffffffa8);
  Data_Impl<std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>_>::Data_Impl
            (this_00,(shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *)t_type);
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::unique_ptr<std::default_delete<chaiscript::detail::Any::Data>,void>
            ((unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
              *)in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *)0x3b9884);
  return;
}

Assistant:

explicit Any(ValueType &&t_value)
          : m_data(std::unique_ptr<Data>(new Data_Impl<typename std::decay<ValueType>::type>(std::forward<ValueType>(t_value))))
        {
        }